

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_4;
  BinaryExpressionSyntax *pBVar1;
  Token TVar2;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_00000068;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000070;
  BumpAllocator *in_stack_00000108;
  Token *in_stack_00000110;
  BumpAllocator *in_stack_ffffffffffffffb8;
  ExpressionSyntax *args_1;
  
  args_1 = (ExpressionSyntax *)__child_stack;
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x27a690);
  deepClone<slang::syntax::ExpressionSyntax>
            ((ExpressionSyntax *)__child_stack,in_stack_ffffffffffffffb8);
  TVar2 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  args_4 = deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000070,in_stack_00000068);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x27a6e5);
  deepClone<slang::syntax::ExpressionSyntax>
            ((ExpressionSyntax *)__child_stack,in_stack_ffffffffffffffb8);
  pBVar1 = BumpAllocator::
           emplace<slang::syntax::BinaryExpressionSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::ExpressionSyntax&>
                     (unaff_retaddr,(SyntaxKind *)__fn,args_1,(Token *)TVar2.info,TVar2._0_8_,
                      (ExpressionSyntax *)args_4);
  return (int)pBVar1;
}

Assistant:

static SyntaxNode* clone(const BinaryExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<BinaryExpressionSyntax>(
        node.kind,
        *deepClone<ExpressionSyntax>(*node.left, alloc),
        node.operatorToken.deepClone(alloc),
        *deepClone(node.attributes, alloc),
        *deepClone<ExpressionSyntax>(*node.right, alloc)
    );
}